

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameTableFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  byte bVar1;
  sqlite3 *db;
  int iVar2;
  uint uVar3;
  RenameToken *pToken_1;
  char *pcVar4;
  char *zName;
  char *pcVar5;
  i64 iVar6;
  RenameToken *pRVar7;
  TriggerStep *pTVar8;
  RenameToken *pToken_2;
  FKey *pFVar9;
  long lVar10;
  RenameToken **ppRVar11;
  RenameToken *pToken_4;
  RenameToken *pRVar12;
  RenameToken *pRVar13;
  RenameToken *pToken;
  RenameCtx sCtx;
  Parse sParse;
  RenameCtx local_288;
  sqlite3_context *local_268;
  char *local_260;
  char *local_258;
  sqlite3_xauth local_250;
  char *local_248;
  sqlite3_value **local_240;
  Walker local_238;
  Parse local_208;
  NameContext local_68;
  
  db = context->pOut->db;
  local_258 = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar4 = (char *)sqlite3ValueText(argv[3],'\x01');
  zName = (char *)sqlite3ValueText(argv[4],'\x01');
  pcVar5 = (char *)sqlite3ValueText(argv[5],'\x01');
  local_240 = argv;
  iVar6 = sqlite3VdbeIntValue(argv[6]);
  if (pcVar5 == (char *)0x0 || (zName == (char *)0x0 || pcVar4 == (char *)0x0)) {
    return;
  }
  local_250 = db->xAuth;
  db->xAuth = (sqlite3_xauth)0x0;
  local_268 = context;
  local_260 = pcVar4;
  local_248 = pcVar5;
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  pcVar4 = local_258;
  local_288.pTab = (Table *)0x0;
  local_288.zOld = (char *)0x0;
  local_288.pList = (RenameToken *)0x0;
  local_288.nList = 0;
  local_288.iCol = 0;
  local_288.pTab = sqlite3FindTable(db,zName,local_258);
  local_238.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_238.walkerDepth = 0;
  local_238.eCode = '\0';
  local_238._37_3_ = 0;
  local_238.xExprCallback = renameTableExprCb;
  local_238.xSelectCallback = renameTableSelectCb;
  local_238.pParse = &local_208;
  local_238.u.pNC = (NameContext *)&local_288;
  iVar2 = renameParseSql(&local_208,pcVar4,1,db,local_260,(int)iVar6);
  if (iVar2 == 0) {
    uVar3 = (uint)db->flags;
    if (local_208.pNewTable == (Table *)0x0) {
      if (local_208.pNewIndex == (Index *)0x0) {
        pcVar4 = (local_208.pNewTrigger)->table;
        if (pcVar4 != (char *)0x0) {
          lVar10 = 0;
          do {
            bVar1 = pcVar4[lVar10];
            if (bVar1 == zName[lVar10]) {
              if ((ulong)bVar1 == 0) goto LAB_001bf3a0;
            }
            else if (""[bVar1] != ""[(byte)zName[lVar10]]) break;
            lVar10 = lVar10 + 1;
          } while( true );
        }
        goto LAB_001bf424;
      }
      if (local_208.pRename != (RenameToken *)0x0) {
        if ((char *)(local_208.pRename)->p == (local_208.pNewIndex)->zName) {
          ppRVar11 = &local_208.pRename;
          pRVar7 = local_208.pRename;
        }
        else {
          do {
            pRVar7 = local_208.pRename;
            local_208.pRename = pRVar7->pNext;
            if (local_208.pRename == (RenameToken *)0x0) goto LAB_001bf372;
          } while ((char *)(local_208.pRename)->p != (local_208.pNewIndex)->zName);
          ppRVar11 = &pRVar7->pNext;
          pRVar7 = local_208.pRename;
        }
        *ppRVar11 = pRVar7->pNext;
        pRVar7->pNext = local_288.pList;
        local_288.nList = local_288.nList + 1;
        local_288.pList = pRVar7;
      }
LAB_001bf372:
      if (((uVar3 >> 0x1a & 1) == 0) && ((local_208.pNewIndex)->pPartIdxWhere != (Expr *)0x0)) {
        walkExpr(&local_238,(local_208.pNewIndex)->pPartIdxWhere);
      }
    }
    else if ((local_208.pNewTable)->pSelect == (Select *)0x0) {
      if ((((byte)(db->flags >> 0x1a) & 0x3f & (uVar3 >> 0xe & 1) == 0) == 0) &&
         (pFVar9 = (local_208.pNewTable)->pFKey, pFVar9 != (FKey *)0x0)) {
        pRVar7 = local_288.pList;
        iVar2 = local_288.nList;
LAB_001bf1f0:
        pcVar4 = pFVar9->zTo;
        if (pcVar4 != (char *)0x0) {
          lVar10 = 0;
          do {
            bVar1 = pcVar4[lVar10];
            if (bVar1 == zName[lVar10]) {
              if ((ulong)bVar1 == 0) goto LAB_001bf222;
            }
            else if (""[bVar1] != ""[(byte)zName[lVar10]]) break;
            lVar10 = lVar10 + 1;
          } while( true );
        }
        goto LAB_001bf264;
      }
LAB_001bf26d:
      pcVar4 = (local_208.pNewTable)->zName;
      if (pcVar4 != (char *)0x0) {
        lVar10 = 0;
        do {
          bVar1 = zName[lVar10];
          if (bVar1 == pcVar4[lVar10]) {
            if ((ulong)bVar1 == 0) goto LAB_001bf2fe;
          }
          else if (""[bVar1] != ""[(byte)pcVar4[lVar10]]) break;
          lVar10 = lVar10 + 1;
        } while( true );
      }
    }
    else if ((uVar3 >> 0x1a & 1) == 0) {
      local_68.ncFlags = 0;
      local_68._44_4_ = 0;
      local_68.pWinSelect = (Select *)0x0;
      local_68.pNext = (NameContext *)0x0;
      local_68.nRef = 0;
      local_68.nErr = 0;
      local_68.pSrcList = (SrcList *)0x0;
      local_68.uNC.pEList = (ExprList *)0x0;
      local_68.pParse = &local_208;
      sqlite3SelectPrep(&local_208,(local_208.pNewTable)->pSelect,&local_68);
      sqlite3WalkSelect(&local_238,(local_208.pNewTable)->pSelect);
      iVar2 = local_208.rc;
      if (local_208.rc != 0 && local_208.nErr != 0) goto LAB_001bf51e;
    }
    goto LAB_001bf4fa;
  }
  goto LAB_001bf51e;
LAB_001bf3a0:
  if (local_208.pRename != (RenameToken *)0x0 &&
      (local_288.pTab)->pSchema == (local_208.pNewTrigger)->pTabSchema) {
    pRVar7 = local_208.pRename;
    if ((char *)(local_208.pRename)->p == pcVar4) {
      ppRVar11 = &local_208.pRename;
    }
    else {
      do {
        pRVar13 = pRVar7;
        pRVar7 = pRVar13->pNext;
        if (pRVar7 == (RenameToken *)0x0) goto LAB_001bf424;
      } while ((char *)pRVar7->p != pcVar4);
      ppRVar11 = &pRVar13->pNext;
    }
    *ppRVar11 = pRVar7->pNext;
    pRVar7->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar7;
  }
LAB_001bf424:
  if ((uVar3 >> 0x1a & 1) == 0) {
    pcVar4 = (char *)0x0;
    if ((int)iVar6 == 0) {
      pcVar4 = local_258;
    }
    iVar2 = renameResolveTrigger(&local_208,pcVar4);
    if (iVar2 != 0) goto LAB_001bf51e;
    renameWalkTrigger(&local_238,local_208.pNewTrigger);
    pTVar8 = (local_208.pNewTrigger)->step_list;
    if (pTVar8 != (TriggerStep *)0x0) {
      pRVar7 = local_288.pList;
      iVar2 = local_288.nList;
LAB_001bf47d:
      pcVar4 = pTVar8->zTarget;
      if (pcVar4 != (char *)0x0) {
        lVar10 = 0;
        do {
          bVar1 = pcVar4[lVar10];
          if (bVar1 == zName[lVar10]) {
            if ((ulong)bVar1 == 0) goto LAB_001bf4af;
          }
          else if (""[bVar1] != ""[(byte)zName[lVar10]]) break;
          lVar10 = lVar10 + 1;
        } while( true );
      }
      goto LAB_001bf4f1;
    }
  }
  goto LAB_001bf4fa;
LAB_001bf4af:
  if (local_208.pRename != (RenameToken *)0x0) {
    pRVar13 = local_208.pRename;
    ppRVar11 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar4) {
      do {
        pRVar12 = pRVar13;
        pRVar13 = pRVar12->pNext;
        if (pRVar13 == (RenameToken *)0x0) goto LAB_001bf4f1;
      } while ((char *)pRVar13->p != pcVar4);
      ppRVar11 = &pRVar12->pNext;
    }
    *ppRVar11 = pRVar13->pNext;
    pRVar13->pNext = pRVar7;
    iVar2 = iVar2 + 1;
    local_288.nList = iVar2;
    pRVar7 = pRVar13;
    local_288.pList = pRVar13;
  }
LAB_001bf4f1:
  pTVar8 = pTVar8->pNext;
  if (pTVar8 == (TriggerStep *)0x0) goto LAB_001bf4fa;
  goto LAB_001bf47d;
LAB_001bf222:
  if (local_208.pRename != (RenameToken *)0x0) {
    pRVar13 = local_208.pRename;
    ppRVar11 = &local_208.pRename;
    if ((char *)(local_208.pRename)->p != pcVar4) {
      do {
        pRVar12 = pRVar13;
        pRVar13 = pRVar12->pNext;
        if (pRVar13 == (RenameToken *)0x0) goto LAB_001bf264;
      } while ((char *)pRVar13->p != pcVar4);
      ppRVar11 = &pRVar12->pNext;
    }
    *ppRVar11 = pRVar13->pNext;
    pRVar13->pNext = pRVar7;
    iVar2 = iVar2 + 1;
    local_288.nList = iVar2;
    pRVar7 = pRVar13;
    local_288.pList = pRVar13;
  }
LAB_001bf264:
  pFVar9 = pFVar9->pNextFrom;
  if (pFVar9 == (FKey *)0x0) goto LAB_001bf26d;
  goto LAB_001bf1f0;
LAB_001bf2fe:
  local_288.pTab = local_208.pNewTable;
  if ((uVar3 >> 0x1a & 1) == 0) {
    sqlite3WalkExprList(&local_238,(local_208.pNewTable)->pCheck);
    pcVar4 = (local_208.pNewTable)->zName;
  }
  if (local_208.pRename != (RenameToken *)0x0) {
    if ((char *)(local_208.pRename)->p == pcVar4) {
      ppRVar11 = &local_208.pRename;
      pRVar7 = local_208.pRename;
    }
    else {
      do {
        pRVar7 = local_208.pRename;
        local_208.pRename = pRVar7->pNext;
        if (local_208.pRename == (RenameToken *)0x0) goto LAB_001bf4fa;
      } while ((char *)(local_208.pRename)->p != pcVar4);
      ppRVar11 = &pRVar7->pNext;
      pRVar7 = local_208.pRename;
    }
    *ppRVar11 = pRVar7->pNext;
    pRVar7->pNext = local_288.pList;
    local_288.nList = local_288.nList + 1;
    local_288.pList = pRVar7;
  }
LAB_001bf4fa:
  iVar2 = renameEditSql(local_268,&local_288,local_260,local_248,1);
  if (iVar2 != 0) {
LAB_001bf51e:
    if (local_208.zErrMsg == (char *)0x0) {
      sqlite3_result_error_code(local_268,iVar2);
    }
    else {
      renameColumnParseError(local_268,0,local_240[1],local_240[2],&local_208);
    }
  }
  renameParseCleanup(&local_208);
  pRVar7 = local_288.pList;
  while (pRVar7 != (RenameToken *)0x0) {
    pRVar13 = pRVar7->pNext;
    sqlite3DbFreeNN(db,pRVar7);
    pRVar7 = pRVar13;
  }
  if (db->noSharedCache == '\0') {
    btreeLeaveAll(db);
  }
  db->xAuth = local_250;
  return;
}

Assistant:

static void renameTableFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zDb = (const char*)sqlite3_value_text(argv[0]);
  const char *zInput = (const char*)sqlite3_value_text(argv[3]);
  const char *zOld = (const char*)sqlite3_value_text(argv[4]);
  const char *zNew = (const char*)sqlite3_value_text(argv[5]);
  int bTemp = sqlite3_value_int(argv[6]);
  UNUSED_PARAMETER(NotUsed);

  if( zInput && zOld && zNew ){
    Parse sParse;
    int rc;
    int bQuote = 1;
    RenameCtx sCtx;
    Walker sWalker;

#ifndef SQLITE_OMIT_AUTHORIZATION
    sqlite3_xauth xAuth = db->xAuth;
    db->xAuth = 0;
#endif

    sqlite3BtreeEnterAll(db);

    memset(&sCtx, 0, sizeof(RenameCtx));
    sCtx.pTab = sqlite3FindTable(db, zOld, zDb);
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = &sParse;
    sWalker.xExprCallback = renameTableExprCb;
    sWalker.xSelectCallback = renameTableSelectCb;
    sWalker.u.pRename = &sCtx;

    rc = renameParseSql(&sParse, zDb, 1, db, zInput, bTemp);

    if( rc==SQLITE_OK ){
      int isLegacy = (db->flags & SQLITE_LegacyAlter);
      if( sParse.pNewTable ){
        Table *pTab = sParse.pNewTable;

        if( pTab->pSelect ){
          if( isLegacy==0 ){
            NameContext sNC;
            memset(&sNC, 0, sizeof(sNC));
            sNC.pParse = &sParse;

            sqlite3SelectPrep(&sParse, pTab->pSelect, &sNC);
            if( sParse.nErr ) rc = sParse.rc;
            sqlite3WalkSelect(&sWalker, pTab->pSelect);
          }
        }else{
          /* Modify any FK definitions to point to the new table. */
#ifndef SQLITE_OMIT_FOREIGN_KEY
          if( isLegacy==0 || (db->flags & SQLITE_ForeignKeys) ){
            FKey *pFKey;
            for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
              if( sqlite3_stricmp(pFKey->zTo, zOld)==0 ){
                renameTokenFind(&sParse, &sCtx, (void*)pFKey->zTo);
              }
            }
          }
#endif

          /* If this is the table being altered, fix any table refs in CHECK
          ** expressions. Also update the name that appears right after the
          ** "CREATE [VIRTUAL] TABLE" bit. */
          if( sqlite3_stricmp(zOld, pTab->zName)==0 ){
            sCtx.pTab = pTab;
            if( isLegacy==0 ){
              sqlite3WalkExprList(&sWalker, pTab->pCheck);
            }
            renameTokenFind(&sParse, &sCtx, pTab->zName);
          }
        }
      }

      else if( sParse.pNewIndex ){
        renameTokenFind(&sParse, &sCtx, sParse.pNewIndex->zName);
        if( isLegacy==0 ){
          sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
        }
      }

#ifndef SQLITE_OMIT_TRIGGER
      else{
        Trigger *pTrigger = sParse.pNewTrigger;
        TriggerStep *pStep;
        if( 0==sqlite3_stricmp(sParse.pNewTrigger->table, zOld) 
            && sCtx.pTab->pSchema==pTrigger->pTabSchema
          ){
          renameTokenFind(&sParse, &sCtx, sParse.pNewTrigger->table);
        }

        if( isLegacy==0 ){
          rc = renameResolveTrigger(&sParse, bTemp ? 0 : zDb);
          if( rc==SQLITE_OK ){
            renameWalkTrigger(&sWalker, pTrigger);
            for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
              if( pStep->zTarget && 0==sqlite3_stricmp(pStep->zTarget, zOld) ){
                renameTokenFind(&sParse, &sCtx, pStep->zTarget);
              }
            }
          }
        }
      }
#endif
    }

    if( rc==SQLITE_OK ){
      rc = renameEditSql(context, &sCtx, zInput, zNew, bQuote);
    }
    if( rc!=SQLITE_OK ){
      if( sParse.zErrMsg ){
        renameColumnParseError(context, 0, argv[1], argv[2], &sParse);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }

    renameParseCleanup(&sParse);
    renameTokenFree(db, sCtx.pList);
    sqlite3BtreeLeaveAll(db);
#ifndef SQLITE_OMIT_AUTHORIZATION
    db->xAuth = xAuth;
#endif
  }

  return;
}